

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

Entity * __thiscall
lf::refinement::MeshHierarchy::ParentEntity(MeshHierarchy *this,size_type level,Entity *e)

{
  size_type level_00;
  dim_t codim;
  pointer psVar1;
  ostream *stream;
  runtime_error *this_00;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  stringstream local_458 [8];
  stringstream ss_1;
  ostream local_448 [376];
  const_reference local_2d0;
  ParentInfo *e_parent_info;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *parent_infos;
  undefined1 local_2b8 [4];
  glb_idx_t idx_e;
  pointer local_2a8;
  Mesh *mesh;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Entity *local_20;
  Entity *e_local;
  MeshHierarchy *pMStack_10;
  size_type level_local;
  MeshHierarchy *this_local;
  
  local_20 = e;
  e_local._4_4_ = level;
  pMStack_10 = this;
  if (level == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"level > 0 required!");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"level > 0",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d8,&local_200,0x758,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"",(allocator<char> *)((long)&mesh + 7));
    lf::base::AssertionFailed(&local_248,&local_270,0x758,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator((allocator<char> *)((long)&mesh + 7));
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    abort();
  }
  getMesh((MeshHierarchy *)local_2b8,(size_type)this);
  psVar1 = (pointer)std::
                    __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator*((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_2b8);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_2b8);
  local_2a8 = psVar1;
  parent_infos._4_4_ =
       (*(code *)(psVar1->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[5].
                 _vptr_Mesh)(psVar1,local_20);
  level_00 = e_local._4_4_;
  codim = (**local_20->_vptr_Entity)();
  e_parent_info = (ParentInfo *)ParentInfos(this,level_00,codim);
  local_2d0 = std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::
              operator[]((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>
                          *)e_parent_info,(ulong)parent_infos._4_4_);
  if (local_2d0->parent_ptr == (Entity *)0x0) {
    std::__cxx11::stringstream::stringstream(local_458);
    stream = std::operator<<(local_448,"No valid parent information for ");
    lf::mesh::operator<<(stream,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"e_parent_info.parent_ptr != nullptr",&local_479);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_4a1);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_478,&local_4a0,0x764,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_2d0->parent_ptr;
}

Assistant:

const lf::mesh::Entity *MeshHierarchy::ParentEntity(
    size_type level, const lf::mesh::Entity &e) const {
  LF_ASSERT_MSG(level > 0, "level > 0 required!");
  // Obtain reference to fine mesh
  const lf::mesh::Mesh &mesh{*getMesh(level)};
  // Get index of entity in fine mesh
  const lf::base::glb_idx_t idx_e{mesh.Index(e)};
  // Access information about parent entity on next coarser mesh
  const std::vector<ParentInfo> &parent_infos{ParentInfos(level, e.Codim())};
  // Fetch ParentInfo structure for entity e
  const ParentInfo &e_parent_info{parent_infos[idx_e]};
  // Just return the information contained in the relevant ParentInfo
  // structure
  LF_VERIFY_MSG(e_parent_info.parent_ptr != nullptr,
                "No valid parent information for " << e);
  return e_parent_info.parent_ptr;
}